

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_cli.c
# Opt level: O1

int ssl_parse_alpn_ext(mbedtls_ssl_context *ssl,uchar *buf,size_t len)

{
  int iVar1;
  ulong uVar2;
  size_t sVar3;
  char **ppcVar4;
  ulong __n;
  char *__s;
  
  ppcVar4 = ssl->conf->alpn_list;
  if ((((3 < len && ppcVar4 != (char **)0x0) &&
       (uVar2 = (ulong)(ushort)(*(ushort *)buf << 8 | *(ushort *)buf >> 8), uVar2 == len - 2)) &&
      (__n = (ulong)buf[2], uVar2 - 1 == __n)) && (__s = *ppcVar4, __s != (char *)0x0)) {
    do {
      ppcVar4 = ppcVar4 + 1;
      sVar3 = strlen(__s);
      if ((sVar3 == __n) && (iVar1 = bcmp(buf + 3,__s,__n), iVar1 == 0)) {
        ssl->alpn_chosen = __s;
        return 0;
      }
      __s = *ppcVar4;
    } while (__s != (char *)0x0);
  }
  return -0x7980;
}

Assistant:

static int ssl_parse_alpn_ext( mbedtls_ssl_context *ssl,
                               const unsigned char *buf, size_t len )
{
    size_t list_len, name_len;
    const char **p;

    /* If we didn't send it, the server shouldn't send it */
    if( ssl->conf->alpn_list == NULL )
        return( MBEDTLS_ERR_SSL_BAD_HS_SERVER_HELLO );

    /*
     * opaque ProtocolName<1..2^8-1>;
     *
     * struct {
     *     ProtocolName protocol_name_list<2..2^16-1>
     * } ProtocolNameList;
     *
     * the "ProtocolNameList" MUST contain exactly one "ProtocolName"
     */

    /* Min length is 2 (list_len) + 1 (name_len) + 1 (name) */
    if( len < 4 )
        return( MBEDTLS_ERR_SSL_BAD_HS_SERVER_HELLO );

    list_len = ( buf[0] << 8 ) | buf[1];
    if( list_len != len - 2 )
        return( MBEDTLS_ERR_SSL_BAD_HS_SERVER_HELLO );

    name_len = buf[2];
    if( name_len != list_len - 1 )
        return( MBEDTLS_ERR_SSL_BAD_HS_SERVER_HELLO );

    /* Check that the server chosen protocol was in our list and save it */
    for( p = ssl->conf->alpn_list; *p != NULL; p++ )
    {
        if( name_len == strlen( *p ) &&
            memcmp( buf + 3, *p, name_len ) == 0 )
        {
            ssl->alpn_chosen = *p;
            return( 0 );
        }
    }

    return( MBEDTLS_ERR_SSL_BAD_HS_SERVER_HELLO );
}